

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

TestCase * __thiscall doctest::detail::TestCase::operator=(TestCase *this,TestCase *other)

{
  char *pcVar1;
  TestCase *other_local;
  TestCase *this_local;
  
  TestCaseData::operator=(&this->super_TestCaseData,&other->super_TestCaseData);
  this->m_test = other->m_test;
  String::operator=(&this->m_type,&other->m_type);
  this->m_template_id = other->m_template_id;
  String::operator=(&this->m_full_name,&other->m_full_name);
  if (this->m_template_id != -1) {
    pcVar1 = String::c_str(&this->m_full_name);
    (this->super_TestCaseData).m_name = pcVar1;
  }
  return this;
}

Assistant:

TestCase& TestCase::operator=(const TestCase& other) {
        TestCaseData::operator=(other);
        m_test        = other.m_test;
        m_type        = other.m_type;
        m_template_id = other.m_template_id;
        m_full_name   = other.m_full_name;

        if(m_template_id != -1)
            m_name = m_full_name.c_str();
        return *this;
    }